

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::output_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  uint uVar1;
  undefined4 uVar2;
  int *piVar3;
  code *pcVar4;
  ulong uVar5;
  bool bVar6;
  _Ios_Openmode _Var7;
  action_score *paVar8;
  int **ppiVar9;
  size_t sVar10;
  cb_class *pcVar11;
  ostream *poVar12;
  long in_RDX;
  long in_RDI;
  size_t i;
  v_array<CB::cb_class> costs;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  uint32_t action;
  bool labeled_example;
  example *in_stack_fffffffffffffd10;
  multi_ex *in_stack_fffffffffffffd38;
  example *in_stack_fffffffffffffd40;
  cb_adf *in_stack_fffffffffffffd48;
  vw *in_stack_fffffffffffffd50;
  string local_268 [32];
  ulong local_248;
  v_array<CB::cb_class> local_240;
  stringstream local_210 [16];
  ostream local_200;
  undefined1 in_stack_ffffffffffffff67;
  multi_ex *in_stack_ffffffffffffff68;
  example *in_stack_ffffffffffffff70;
  string local_88 [7];
  undefined1 in_stack_ffffffffffffff7f;
  vw *in_stack_ffffffffffffff80;
  int *local_38;
  
  bVar6 = CB_ALGS::example_is_newline_not_header(in_stack_fffffffffffffd10);
  if (!bVar6) {
    update_statistics(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                      in_stack_fffffffffffffd38);
    paVar8 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(in_RDX + 0x6850),0);
    uVar1 = paVar8->action;
    ppiVar9 = v_array<int>::begin((v_array<int> *)(in_RDI + 0x3510));
    local_38 = *ppiVar9;
    ppiVar9 = v_array<int>::end((v_array<int> *)(in_RDI + 0x3510));
    piVar3 = *ppiVar9;
    for (; local_38 != piVar3; local_38 = local_38 + 1) {
      (**(code **)(in_RDI + 0x3538))((float)uVar1,0,*local_38);
    }
    if (0 < *(int *)(in_RDI + 0x3530)) {
      std::__cxx11::string::string(local_88);
      _Var7 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_210,local_88,_Var7);
      local_240._begin = *(cb_class **)(in_RDX + 0x6828);
      local_240._end = *(cb_class **)(in_RDX + 0x6830);
      local_240.end_array = *(cb_class **)(in_RDX + 0x6838);
      local_240.erase_count = *(size_t *)(in_RDX + 0x6840);
      for (local_248 = 0; uVar5 = local_248, sVar10 = v_array<CB::cb_class>::size(&local_240),
          uVar5 < sVar10; local_248 = local_248 + 1) {
        if (local_248 != 0) {
          std::operator<<(&local_200,' ');
        }
        poVar12 = &local_200;
        pcVar11 = v_array<CB::cb_class>::operator[](&local_240,local_248);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,pcVar11->action);
        poVar12 = std::operator<<(poVar12,':');
        pcVar11 = v_array<CB::cb_class>::operator[](&local_240,local_248);
        std::ostream::operator<<(poVar12,pcVar11->partial_prediction);
      }
      pcVar4 = *(code **)(in_RDI + 0x3540);
      uVar2 = *(undefined4 *)(in_RDI + 0x3530);
      std::__cxx11::stringstream::str();
      (*pcVar4)(uVar2,local_268);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::stringstream::~stringstream(local_210);
      std::__cxx11::string::~string(local_88);
    }
    CB::print_update(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f,
                     in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (bool)in_stack_ffffffffffffff67);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  uint32_t action = ec.pred.a_s[0].action;
  for (int sink : all.final_prediction_sink) all.print(sink, (float)action, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}